

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O2

int lnode_call_file(lua_State *L,char *filename)

{
  FILE *__stream;
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  
  iVar1 = luaL_loadfilex(L,filename,(char *)0x0);
  if ((iVar1 == 0) && (iVar1 = lua_pcallk(L,0,1,0,0,(lua_KFunction)0x0), iVar1 == 0)) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 3) {
      return 0;
    }
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
    return (int)lVar2;
  }
  __stream = _stderr;
  pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
  fprintf(__stream,"%s\n",pcVar3);
  return -1;
}

Assistant:

LUALIB_API int lnode_call_file(lua_State* L, const char* filename) {
  // Load the *.lua script

  if (luaL_loadfilex(L, filename, NULL)) {
    fprintf(stderr, "%s\n", lua_tostring(L, -1));
    return -1;
  }

  // Start the main script.
  if (lua_pcall(L, 0, 1, 0)) {
    fprintf(stderr, "%s\n", lua_tostring(L, -1));
    return -1;
  }

  // Use the return value from the script as process exit code.
  int ret = 0;
  if (lua_type(L, -1) == LUA_TNUMBER) {
    ret = lua_tointeger(L, -1);
  }

  return ret;
}